

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::InternalExtensionMergeFrom
          (ExtensionSet *this,int number,Extension *other_extension)

{
  anon_union_8_21_eb924b1f_for_Extension_0 aVar1;
  bool bVar2;
  int32 iVar3;
  FieldDescriptor *pFVar4;
  long *plVar5;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar6;
  Rep *pRVar7;
  RepeatedField<bool> *this_00;
  RepeatedPtrFieldBase *this_01;
  byte bVar8;
  Extension *pEVar9;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar10;
  MessageLite *pMVar11;
  LazyMessageExtension *pLVar12;
  undefined4 extraout_var;
  string *this_02;
  long *plVar13;
  void **our_elems;
  undefined4 extraout_var_00;
  int64 iVar14;
  undefined4 extraout_var_02;
  _func_int **pp_Var15;
  size_t __n;
  int iVar16;
  RepeatedField<double> *this_03;
  RepeatedField<int> *this_04;
  long lVar17;
  void *__src;
  void *__dest;
  ArenaImpl *pAVar18;
  RepeatedField<int> *pRVar19;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar20;
  long *local_50 [2];
  long local_40 [2];
  undefined4 extraout_var_01;
  
  if (other_extension->is_repeated != true) {
    if ((other_extension->field_0xa & 1) != 0) {
      return;
    }
    bVar8 = other_extension->type;
    switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar8 * 4)) {
    case 1:
    case 3:
    case 8:
      iVar3 = (other_extension->field_0).int32_value;
      pFVar4 = other_extension->descriptor;
      pVar20 = Insert(this,number);
      pEVar9 = pVar20.first;
      pEVar9->descriptor = pFVar4;
      if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar9->type = bVar8;
        pEVar9->is_repeated = false;
      }
      pEVar9->field_0xa = pEVar9->field_0xa & 0xf0;
      (pEVar9->field_0).int32_value = iVar3;
      return;
    case 2:
    case 4:
      aVar1 = other_extension->field_0;
      pFVar4 = other_extension->descriptor;
      pVar20 = Insert(this,number);
      pEVar9 = pVar20.first;
      pEVar9->descriptor = pFVar4;
      if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar9->type = bVar8;
        pEVar9->is_repeated = false;
      }
      pEVar9->field_0xa = pEVar9->field_0xa & 0xf0;
      pEVar9->field_0 = aVar1;
      return;
    case 5:
      aVar1 = other_extension->field_0;
      pFVar4 = other_extension->descriptor;
      pVar20 = Insert(this,number);
      pEVar9 = pVar20.first;
      pEVar9->descriptor = pFVar4;
      if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar9->type = bVar8;
        pEVar9->is_repeated = false;
      }
      pEVar9->field_0xa = pEVar9->field_0xa & 0xf0;
      pEVar9->field_0 = aVar1;
      return;
    case 6:
      iVar3 = (other_extension->field_0).int32_value;
      pFVar4 = other_extension->descriptor;
      pVar20 = Insert(this,number);
      pEVar9 = pVar20.first;
      pEVar9->descriptor = pFVar4;
      if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar9->type = bVar8;
        pEVar9->is_repeated = false;
      }
      pEVar9->field_0xa = pEVar9->field_0xa & 0xf0;
      (pEVar9->field_0).int32_value = iVar3;
      return;
    case 7:
      bVar2 = (other_extension->field_0).bool_value;
      pFVar4 = other_extension->descriptor;
      pVar20 = Insert(this,number);
      pEVar9 = pVar20.first;
      pEVar9->descriptor = pFVar4;
      if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar9->type = bVar8;
        pEVar9->is_repeated = false;
      }
      pEVar9->field_0xa = pEVar9->field_0xa & 0xf0;
      (pEVar9->field_0).bool_value = bVar2;
      return;
    case 9:
      pp_Var15 = ((other_extension->field_0).lazymessage_value)->_vptr_LazyMessageExtension;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pp_Var15,
                 (long)(other_extension->field_0).lazymessage_value[1]._vptr_LazyMessageExtension +
                 (long)pp_Var15);
      this_02 = MutableString_abi_cxx11_(this,number,bVar8,other_extension->descriptor);
      std::__cxx11::string::operator=((string *)this_02,(string *)local_50);
      if (local_50[0] == local_40) {
        return;
      }
      operator_delete(local_50[0],local_40[0] + 1);
      return;
    case 10:
      goto switchD_001fe413_caseD_a;
    default:
      return;
    }
  }
  pFVar4 = other_extension->descriptor;
  pVar20 = Insert(this,number);
  pEVar9 = pVar20.first;
  pEVar9->descriptor = pFVar4;
  bVar8 = other_extension->type;
  if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pEVar9->type = bVar8;
    pEVar9->is_packed = other_extension->is_packed;
    pEVar9->is_repeated = true;
  }
  switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar8 * 4)) {
  case 1:
    if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pAVar18 = (ArenaImpl *)this->arena_;
      if (pAVar18 != (ArenaImpl *)0x0) {
        if ((pAVar18->lifecycle_id_ & 1) != 0) {
          InternalExtensionMergeFrom((ExtensionSet *)pAVar18);
        }
        goto LAB_001fe5a1;
      }
LAB_001fe830:
      pMVar11 = (MessageLite *)operator_new(0x10);
      pMVar11->_vptr_MessageLite = (_func_int **)0x0;
      (pMVar11->_internal_metadata_).ptr_ = (void *)0x0;
LAB_001fe840:
      (pEVar9->field_0).message_value = pMVar11;
    }
    goto LAB_001fe843;
  case 2:
    if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pAVar18 = (ArenaImpl *)this->arena_;
      if (pAVar18 == (ArenaImpl *)0x0) {
        pLVar12 = (LazyMessageExtension *)operator_new(0x10);
        pLVar12->_vptr_LazyMessageExtension = (_func_int **)0x0;
        pLVar12[1]._vptr_LazyMessageExtension = (_func_int **)0x0;
      }
      else {
        if ((pAVar18->lifecycle_id_ & 1) != 0) {
          InternalExtensionMergeFrom((ExtensionSet *)pAVar18);
        }
        pLVar12 = (LazyMessageExtension *)
                  ArenaImpl::AllocateAlignedAndAddCleanup
                            (pAVar18,0x10,
                             arena_destruct_object<google::protobuf::RepeatedField<long>>);
        pLVar12->_vptr_LazyMessageExtension = (_func_int **)0x0;
        pLVar12[1]._vptr_LazyMessageExtension = (_func_int **)pAVar18;
      }
      (pEVar9->field_0).lazymessage_value = pLVar12;
    }
    pRVar19 = (other_extension->field_0).repeated_int32_value;
    if (pRVar19->current_size_ == 0) {
      return;
    }
    this_03 = (RepeatedField<double> *)(pEVar9->field_0).repeated_int64_value;
    lVar17 = (long)((RepeatedField<long> *)this_03)->current_size_;
    RepeatedField<long>::Reserve
              ((RepeatedField<long> *)this_03,
               pRVar19->current_size_ + ((RepeatedField<long> *)this_03)->current_size_);
    goto LAB_001fe9f6;
  case 3:
    if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pAVar18 = (ArenaImpl *)this->arena_;
      if (pAVar18 == (ArenaImpl *)0x0) {
        pLVar12 = (LazyMessageExtension *)operator_new(0x10);
        pLVar12->_vptr_LazyMessageExtension = (_func_int **)0x0;
        pLVar12[1]._vptr_LazyMessageExtension = (_func_int **)0x0;
      }
      else {
        if ((pAVar18->lifecycle_id_ & 1) != 0) {
          InternalExtensionMergeFrom((ExtensionSet *)pAVar18);
        }
        pLVar12 = (LazyMessageExtension *)
                  ArenaImpl::AllocateAlignedAndAddCleanup
                            (pAVar18,0x10,
                             arena_destruct_object<google::protobuf::RepeatedField<unsigned_int>>);
        pLVar12->_vptr_LazyMessageExtension = (_func_int **)0x0;
        pLVar12[1]._vptr_LazyMessageExtension = (_func_int **)pAVar18;
      }
      (pEVar9->field_0).lazymessage_value = pLVar12;
    }
    pRVar19 = (other_extension->field_0).repeated_int32_value;
    if (pRVar19->current_size_ == 0) {
      return;
    }
    this_04 = (RepeatedField<int> *)(pEVar9->field_0).repeated_uint32_value;
    lVar17 = (long)((RepeatedField<unsigned_int> *)this_04)->current_size_;
    RepeatedField<unsigned_int>::Reserve
              ((RepeatedField<unsigned_int> *)this_04,
               pRVar19->current_size_ + ((RepeatedField<unsigned_int> *)this_04)->current_size_);
    break;
  case 4:
    if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pAVar18 = (ArenaImpl *)this->arena_;
      if (pAVar18 == (ArenaImpl *)0x0) {
        pLVar12 = (LazyMessageExtension *)operator_new(0x10);
        pLVar12->_vptr_LazyMessageExtension = (_func_int **)0x0;
        pLVar12[1]._vptr_LazyMessageExtension = (_func_int **)0x0;
      }
      else {
        if ((pAVar18->lifecycle_id_ & 1) != 0) {
          InternalExtensionMergeFrom((ExtensionSet *)pAVar18);
        }
        pLVar12 = (LazyMessageExtension *)
                  ArenaImpl::AllocateAlignedAndAddCleanup
                            (pAVar18,0x10,
                             arena_destruct_object<google::protobuf::RepeatedField<unsigned_long>>);
        pLVar12->_vptr_LazyMessageExtension = (_func_int **)0x0;
        pLVar12[1]._vptr_LazyMessageExtension = (_func_int **)pAVar18;
      }
      (pEVar9->field_0).lazymessage_value = pLVar12;
    }
    pRVar19 = (other_extension->field_0).repeated_int32_value;
    if (pRVar19->current_size_ == 0) {
      return;
    }
    this_03 = (RepeatedField<double> *)(pEVar9->field_0).repeated_uint64_value;
    lVar17 = (long)((RepeatedField<unsigned_long> *)this_03)->current_size_;
    RepeatedField<unsigned_long>::Reserve
              ((RepeatedField<unsigned_long> *)this_03,
               pRVar19->current_size_ + ((RepeatedField<unsigned_long> *)this_03)->current_size_);
    goto LAB_001fe9f6;
  case 5:
    if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pAVar18 = (ArenaImpl *)this->arena_;
      if (pAVar18 == (ArenaImpl *)0x0) {
        pLVar12 = (LazyMessageExtension *)operator_new(0x10);
        pLVar12->_vptr_LazyMessageExtension = (_func_int **)0x0;
        pLVar12[1]._vptr_LazyMessageExtension = (_func_int **)0x0;
      }
      else {
        if ((pAVar18->lifecycle_id_ & 1) != 0) {
          InternalExtensionMergeFrom((ExtensionSet *)pAVar18);
        }
        pLVar12 = (LazyMessageExtension *)
                  ArenaImpl::AllocateAlignedAndAddCleanup
                            (pAVar18,0x10,
                             arena_destruct_object<google::protobuf::RepeatedField<double>>);
        pLVar12->_vptr_LazyMessageExtension = (_func_int **)0x0;
        pLVar12[1]._vptr_LazyMessageExtension = (_func_int **)pAVar18;
      }
      (pEVar9->field_0).lazymessage_value = pLVar12;
    }
    pRVar19 = (other_extension->field_0).repeated_int32_value;
    if (pRVar19->current_size_ == 0) {
      return;
    }
    this_03 = (pEVar9->field_0).repeated_double_value;
    lVar17 = (long)this_03->current_size_;
    RepeatedField<double>::Reserve(this_03,pRVar19->current_size_ + this_03->current_size_);
LAB_001fe9f6:
    this_03->current_size_ = this_03->current_size_ + pRVar19->current_size_;
    __dest = (void *)(lVar17 * 8 + (long)this_03->arena_or_elements_);
    __src = pRVar19->arena_or_elements_;
    __n = (long)pRVar19->current_size_ << 3;
    goto LAB_001fea5a;
  case 6:
    if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pAVar18 = (ArenaImpl *)this->arena_;
      if (pAVar18 == (ArenaImpl *)0x0) {
        pLVar12 = (LazyMessageExtension *)operator_new(0x10);
        pLVar12->_vptr_LazyMessageExtension = (_func_int **)0x0;
        pLVar12[1]._vptr_LazyMessageExtension = (_func_int **)0x0;
      }
      else {
        if ((pAVar18->lifecycle_id_ & 1) != 0) {
          InternalExtensionMergeFrom((ExtensionSet *)pAVar18);
        }
        pLVar12 = (LazyMessageExtension *)
                  ArenaImpl::AllocateAlignedAndAddCleanup
                            (pAVar18,0x10,
                             arena_destruct_object<google::protobuf::RepeatedField<float>>);
        pLVar12->_vptr_LazyMessageExtension = (_func_int **)0x0;
        pLVar12[1]._vptr_LazyMessageExtension = (_func_int **)pAVar18;
      }
      (pEVar9->field_0).lazymessage_value = pLVar12;
    }
    pRVar19 = (other_extension->field_0).repeated_int32_value;
    if (pRVar19->current_size_ == 0) {
      return;
    }
    this_04 = (RepeatedField<int> *)(pEVar9->field_0).repeated_float_value;
    lVar17 = (long)((RepeatedField<float> *)this_04)->current_size_;
    RepeatedField<float>::Reserve
              ((RepeatedField<float> *)this_04,
               pRVar19->current_size_ + ((RepeatedField<float> *)this_04)->current_size_);
    break;
  case 7:
    if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pAVar18 = (ArenaImpl *)this->arena_;
      if (pAVar18 == (ArenaImpl *)0x0) {
        pLVar12 = (LazyMessageExtension *)operator_new(0x10);
        pLVar12->_vptr_LazyMessageExtension = (_func_int **)0x0;
        pLVar12[1]._vptr_LazyMessageExtension = (_func_int **)0x0;
      }
      else {
        if ((pAVar18->lifecycle_id_ & 1) != 0) {
          InternalExtensionMergeFrom((ExtensionSet *)pAVar18);
        }
        pLVar12 = (LazyMessageExtension *)
                  ArenaImpl::AllocateAlignedAndAddCleanup
                            (pAVar18,0x10,
                             arena_destruct_object<google::protobuf::RepeatedField<bool>>);
        pLVar12->_vptr_LazyMessageExtension = (_func_int **)0x0;
        pLVar12[1]._vptr_LazyMessageExtension = (_func_int **)pAVar18;
      }
      (pEVar9->field_0).lazymessage_value = pLVar12;
    }
    pRVar19 = (other_extension->field_0).repeated_int32_value;
    if (pRVar19->current_size_ == 0) {
      return;
    }
    this_00 = (pEVar9->field_0).repeated_bool_value;
    iVar16 = this_00->current_size_;
    RepeatedField<bool>::Reserve(this_00,pRVar19->current_size_ + iVar16);
    this_00->current_size_ = this_00->current_size_ + pRVar19->current_size_;
    __dest = (void *)((long)iVar16 + (long)this_00->arena_or_elements_);
    __src = pRVar19->arena_or_elements_;
    __n = (size_t)pRVar19->current_size_;
    goto LAB_001fea5a;
  case 8:
    if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pAVar18 = (ArenaImpl *)this->arena_;
      if (pAVar18 == (ArenaImpl *)0x0) goto LAB_001fe830;
      if ((pAVar18->lifecycle_id_ & 1) != 0) {
        InternalExtensionMergeFrom((ExtensionSet *)pAVar18);
      }
LAB_001fe5a1:
      pMVar11 = (MessageLite *)
                ArenaImpl::AllocateAlignedAndAddCleanup
                          (pAVar18,0x10,arena_destruct_object<google::protobuf::RepeatedField<int>>)
      ;
      pMVar11->_vptr_MessageLite = (_func_int **)0x0;
      (pMVar11->_internal_metadata_).ptr_ = pAVar18;
      goto LAB_001fe840;
    }
LAB_001fe843:
    pRVar19 = (other_extension->field_0).repeated_int32_value;
    if (pRVar19->current_size_ == 0) {
      return;
    }
    this_04 = (pEVar9->field_0).repeated_int32_value;
    lVar17 = (long)this_04->current_size_;
    RepeatedField<int>::Reserve(this_04,pRVar19->current_size_ + this_04->current_size_);
    break;
  case 9:
    if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pAVar18 = (ArenaImpl *)this->arena_;
      if (pAVar18 == (ArenaImpl *)0x0) {
        pRVar10 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)operator_new(0x18);
        (pRVar10->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
        (pRVar10->super_RepeatedPtrFieldBase).current_size_ = 0;
        (pRVar10->super_RepeatedPtrFieldBase).total_size_ = 0;
        (pRVar10->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
      }
      else {
        if ((pAVar18->lifecycle_id_ & 1) != 0) {
          InternalExtensionMergeFrom((ExtensionSet *)pAVar18);
        }
        pRVar10 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)ArenaImpl::AllocateAlignedAndAddCleanup
                               (pAVar18,0x18,
                                arena_destruct_object<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                               );
        (pRVar10->super_RepeatedPtrFieldBase).arena_ = (Arena *)pAVar18;
        (pRVar10->super_RepeatedPtrFieldBase).current_size_ = 0;
        (pRVar10->super_RepeatedPtrFieldBase).total_size_ = 0;
        (pRVar10->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
      }
      (pEVar9->field_0).repeated_string_value = pRVar10;
    }
    iVar16 = (((other_extension->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).
             current_size_;
    if (iVar16 == 0) {
      return;
    }
    this_01 = &((pEVar9->field_0).repeated_string_value)->super_RepeatedPtrFieldBase;
    pRVar7 = (((other_extension->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).rep_;
    our_elems = RepeatedPtrFieldBase::InternalExtend(this_01,iVar16);
    RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
              (this_01,our_elems,pRVar7->elements,iVar16,
               this_01->rep_->allocated_size - this_01->current_size_);
    iVar16 = iVar16 + this_01->current_size_;
    this_01->current_size_ = iVar16;
    if (iVar16 <= this_01->rep_->allocated_size) {
      return;
    }
    this_01->rep_->allocated_size = iVar16;
    return;
  case 10:
    if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pAVar18 = (ArenaImpl *)this->arena_;
      if (pAVar18 == (ArenaImpl *)0x0) {
        pRVar10 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)operator_new(0x18);
        (pRVar10->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
        (pRVar10->super_RepeatedPtrFieldBase).current_size_ = 0;
        (pRVar10->super_RepeatedPtrFieldBase).total_size_ = 0;
        (pRVar10->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
      }
      else {
        if ((pAVar18->lifecycle_id_ & 1) != 0) {
          InternalExtensionMergeFrom((ExtensionSet *)pAVar18);
        }
        pRVar10 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)ArenaImpl::AllocateAlignedAndAddCleanup
                               (pAVar18,0x18,
                                arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                               );
        (pRVar10->super_RepeatedPtrFieldBase).arena_ = (Arena *)pAVar18;
        (pRVar10->super_RepeatedPtrFieldBase).current_size_ = 0;
        (pRVar10->super_RepeatedPtrFieldBase).total_size_ = 0;
        (pRVar10->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
      }
      (pEVar9->field_0).repeated_string_value = pRVar10;
    }
    pRVar10 = (other_extension->field_0).repeated_string_value;
    if (0 < (pRVar10->super_RepeatedPtrFieldBase).current_size_) {
      lVar17 = 0;
      do {
        plVar5 = (long *)((pRVar10->super_RepeatedPtrFieldBase).rep_)->elements[lVar17];
        pRVar6 = (pEVar9->field_0).repeated_string_value;
        pRVar7 = (pRVar6->super_RepeatedPtrFieldBase).rep_;
        if (pRVar7 == (Rep *)0x0) {
LAB_001fe921:
          plVar13 = (long *)(**(code **)(*plVar5 + 0x20))(plVar5,this->arena_);
          RepeatedPtrFieldBase::
          AddAllocatedInternal<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                    ((RepeatedPtrFieldBase *)(pEVar9->field_0).int64_value,plVar13);
        }
        else {
          iVar16 = (pRVar6->super_RepeatedPtrFieldBase).current_size_;
          if (pRVar7->allocated_size <= iVar16) goto LAB_001fe921;
          (pRVar6->super_RepeatedPtrFieldBase).current_size_ = iVar16 + 1;
          plVar13 = (long *)pRVar7->elements[iVar16];
          if (plVar13 == (long *)0x0) goto LAB_001fe921;
        }
        (**(code **)(*plVar13 + 0x40))(plVar13,plVar5);
        lVar17 = lVar17 + 1;
      } while (lVar17 < (pRVar10->super_RepeatedPtrFieldBase).current_size_);
    }
  default:
    return;
  }
  this_04->current_size_ = this_04->current_size_ + pRVar19->current_size_;
  __dest = (void *)(lVar17 * 4 + (long)this_04->arena_or_elements_);
  __src = pRVar19->arena_or_elements_;
  __n = (long)pRVar19->current_size_ << 2;
LAB_001fea5a:
  memcpy(__dest,__src,__n);
  return;
switchD_001fe413_caseD_a:
  pFVar4 = other_extension->descriptor;
  pVar20 = Insert(this,number);
  pEVar9 = pVar20.first;
  pEVar9->descriptor = pFVar4;
  if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    pMVar11 = (pEVar9->field_0).message_value;
    if ((other_extension->field_0xa & 0x10) == 0) {
      if ((pEVar9->field_0xa & 0x10) == 0) {
        (*pMVar11->_vptr_MessageLite[8])();
        goto LAB_001feb6f;
      }
      iVar16 = (*pMVar11->_vptr_MessageLite[4])(pMVar11);
      pMVar11 = (MessageLite *)CONCAT44(extraout_var_02,iVar16);
      goto LAB_001feb63;
    }
    if ((pEVar9->field_0xa & 0x10) != 0) {
      (*pMVar11->_vptr_MessageLite[0xd])(pMVar11);
      goto LAB_001feb6f;
    }
    iVar16 = (*((other_extension->field_0).message_value)->_vptr_MessageLite[3])
                       ((other_extension->field_0).message_value,pMVar11);
    iVar14 = CONCAT44(extraout_var_01,iVar16);
    pp_Var15 = pMVar11->_vptr_MessageLite;
  }
  else {
    pEVar9->type = other_extension->type;
    pEVar9->is_packed = other_extension->is_packed;
    pEVar9->is_repeated = false;
    bVar8 = pEVar9->field_0xa & 0xf;
    if ((other_extension->field_0xa & 0x10) != 0) {
      pEVar9->field_0xa = bVar8 | 0x10;
      iVar16 = (*((other_extension->field_0).message_value)->_vptr_MessageLite[2])
                         ((other_extension->field_0).message_value,this->arena_);
      pMVar11 = (MessageLite *)CONCAT44(extraout_var_00,iVar16);
      (pEVar9->field_0).message_value = pMVar11;
      (*pMVar11->_vptr_MessageLite[0xd])(pMVar11,(other_extension->field_0).int64_value);
      goto LAB_001feb6f;
    }
    pEVar9->field_0xa = bVar8;
    iVar16 = (*((other_extension->field_0).message_value)->_vptr_MessageLite[4])
                       ((other_extension->field_0).message_value,this->arena_);
    pMVar11 = (MessageLite *)CONCAT44(extraout_var,iVar16);
    (pEVar9->field_0).message_value = pMVar11;
LAB_001feb63:
    iVar14 = (other_extension->field_0).int64_value;
    pp_Var15 = pMVar11->_vptr_MessageLite;
  }
  (*pp_Var15[8])(pMVar11,iVar14);
LAB_001feb6f:
  pEVar9->field_0xa = pEVar9->field_0xa & 0xf0;
  return;
}

Assistant:

void ExtensionSet::InternalExtensionMergeFrom(
    int number, const Extension& other_extension) {
  if (other_extension.is_repeated) {
    Extension* extension;
    bool is_new =
        MaybeNewExtension(number, other_extension.descriptor, &extension);
    if (is_new) {
      // Extension did not already exist in set.
      extension->type = other_extension.type;
      extension->is_packed = other_extension.is_packed;
      extension->is_repeated = true;
    } else {
      GOOGLE_DCHECK_EQ(extension->type, other_extension.type);
      GOOGLE_DCHECK_EQ(extension->is_packed, other_extension.is_packed);
      GOOGLE_DCHECK(extension->is_repeated);
    }

    switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, REPEATED_TYPE) \
  case WireFormatLite::CPPTYPE_##UPPERCASE:              \
    if (is_new) {                                        \
      extension->repeated_##LOWERCASE##_value =          \
          Arena::CreateMessage<REPEATED_TYPE>(arena_);   \
    }                                                    \
    extension->repeated_##LOWERCASE##_value->MergeFrom(  \
        *other_extension.repeated_##LOWERCASE##_value);  \
    break;

      HANDLE_TYPE(INT32, int32, RepeatedField<int32>);
      HANDLE_TYPE(INT64, int64, RepeatedField<int64>);
      HANDLE_TYPE(UINT32, uint32, RepeatedField<uint32>);
      HANDLE_TYPE(UINT64, uint64, RepeatedField<uint64>);
      HANDLE_TYPE(FLOAT, float, RepeatedField<float>);
      HANDLE_TYPE(DOUBLE, double, RepeatedField<double>);
      HANDLE_TYPE(BOOL, bool, RepeatedField<bool>);
      HANDLE_TYPE(ENUM, enum, RepeatedField<int>);
      HANDLE_TYPE(STRING, string, RepeatedPtrField<std::string>);
#undef HANDLE_TYPE

      case WireFormatLite::CPPTYPE_MESSAGE:
        if (is_new) {
          extension->repeated_message_value =
              Arena::CreateMessage<RepeatedPtrField<MessageLite>>(arena_);
        }
        // We can't call RepeatedPtrField<MessageLite>::MergeFrom() because
        // it would attempt to allocate new objects.
        RepeatedPtrField<MessageLite>* other_repeated_message =
            other_extension.repeated_message_value;
        for (int i = 0; i < other_repeated_message->size(); i++) {
          const MessageLite& other_message = other_repeated_message->Get(i);
          MessageLite* target =
              reinterpret_cast<internal::RepeatedPtrFieldBase*>(
                  extension->repeated_message_value)
                  ->AddFromCleared<GenericTypeHandler<MessageLite>>();
          if (target == NULL) {
            target = other_message.New(arena_);
            extension->repeated_message_value->AddAllocated(target);
          }
          target->CheckTypeAndMergeFrom(other_message);
        }
        break;
    }
  } else {
    if (!other_extension.is_cleared) {
      switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, CAMELCASE)  \
  case WireFormatLite::CPPTYPE_##UPPERCASE:           \
    Set##CAMELCASE(number, other_extension.type,      \
                   other_extension.LOWERCASE##_value, \
                   other_extension.descriptor);       \
    break;

        HANDLE_TYPE(INT32, int32, Int32);
        HANDLE_TYPE(INT64, int64, Int64);
        HANDLE_TYPE(UINT32, uint32, UInt32);
        HANDLE_TYPE(UINT64, uint64, UInt64);
        HANDLE_TYPE(FLOAT, float, Float);
        HANDLE_TYPE(DOUBLE, double, Double);
        HANDLE_TYPE(BOOL, bool, Bool);
        HANDLE_TYPE(ENUM, enum, Enum);
#undef HANDLE_TYPE
        case WireFormatLite::CPPTYPE_STRING:
          SetString(number, other_extension.type, *other_extension.string_value,
                    other_extension.descriptor);
          break;
        case WireFormatLite::CPPTYPE_MESSAGE: {
          Extension* extension;
          bool is_new =
              MaybeNewExtension(number, other_extension.descriptor, &extension);
          if (is_new) {
            extension->type = other_extension.type;
            extension->is_packed = other_extension.is_packed;
            extension->is_repeated = false;
            if (other_extension.is_lazy) {
              extension->is_lazy = true;
              extension->lazymessage_value =
                  other_extension.lazymessage_value->New(arena_);
              extension->lazymessage_value->MergeFrom(
                  *other_extension.lazymessage_value);
            } else {
              extension->is_lazy = false;
              extension->message_value =
                  other_extension.message_value->New(arena_);
              extension->message_value->CheckTypeAndMergeFrom(
                  *other_extension.message_value);
            }
          } else {
            GOOGLE_DCHECK_EQ(extension->type, other_extension.type);
            GOOGLE_DCHECK_EQ(extension->is_packed, other_extension.is_packed);
            GOOGLE_DCHECK(!extension->is_repeated);
            if (other_extension.is_lazy) {
              if (extension->is_lazy) {
                extension->lazymessage_value->MergeFrom(
                    *other_extension.lazymessage_value);
              } else {
                extension->message_value->CheckTypeAndMergeFrom(
                    other_extension.lazymessage_value->GetMessage(
                        *extension->message_value));
              }
            } else {
              if (extension->is_lazy) {
                extension->lazymessage_value
                    ->MutableMessage(*other_extension.message_value)
                    ->CheckTypeAndMergeFrom(*other_extension.message_value);
              } else {
                extension->message_value->CheckTypeAndMergeFrom(
                    *other_extension.message_value);
              }
            }
          }
          extension->is_cleared = false;
          break;
        }
      }
    }
  }
}